

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

Literal * wasm::extendF32<(wasm::LaneOrder)0>(Literal *__return_storage_ptr__,Literal *vec)

{
  Literal *pLVar1;
  Literal *pLVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  Type *__return_storage_ptr___00;
  undefined1 local_e8 [8];
  LaneArray<4> lanes;
  LaneArray<2> result;
  anon_union_16_6_1532cd5a_for_Literal_0 local_50;
  undefined8 local_40;
  Literal *local_38;
  
  __return_storage_ptr___00 = (Type *)local_e8;
  local_38 = __return_storage_ptr__;
  Literal::getLanesF32x4((LaneArray<4> *)__return_storage_ptr___00,vec);
  result._M_elems[1].field_0.i64 = 0;
  result._M_elems[1].field_0.func.super_IString.str._M_str = (char *)0x0;
  result._M_elems[0].field_0.func.super_IString.str._M_str = (char *)0x0;
  result._M_elems[0].type.id = 0;
  lanes._M_elems[3].type.id = 0;
  result._M_elems[0].field_0.i64 = 0;
  bVar3 = true;
  pLVar1 = lanes._M_elems + 3;
  do {
    bVar4 = bVar3;
    if (__return_storage_ptr___00[2].id != 4) {
      __assert_fail("type == Type::f32",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                    ,0x12d,"float wasm::Literal::getf32() const");
    }
    local_50.i64 = (int64_t)(double)*(float *)&((Literal *)&__return_storage_ptr___00->id)->field_0;
    local_40 = 5;
    Literal::~Literal((Literal *)&pLVar1->type);
    Literal::Literal((Literal *)&pLVar1->type,(Literal *)&local_50.func);
    Literal::~Literal((Literal *)&local_50.func);
    pLVar2 = local_38;
    __return_storage_ptr___00 = &lanes._M_elems[0].type;
    bVar3 = false;
    pLVar1 = result._M_elems;
  } while (bVar4);
  Literal::Literal(local_38,(LaneArray<2> *)&lanes._M_elems[3].type);
  lVar5 = 0x18;
  do {
    Literal::~Literal((Literal *)((long)&lanes._M_elems[3].type.id + lVar5));
    lVar5 = lVar5 + -0x18;
  } while (lVar5 != -0x18);
  lVar5 = 0x48;
  do {
    Literal::~Literal((Literal *)(local_e8 + lVar5));
    lVar5 = lVar5 + -0x18;
  } while (lVar5 != -0x18);
  return pLVar2;
}

Assistant:

Literal extendF32(const Literal& vec) {
  LaneArray<4> lanes = vec.getLanesF32x4();
  LaneArray<2> result;
  for (size_t i = 0; i < 2; ++i) {
    size_t idx = (Side == LaneOrder::Low) ? i : i + 2;
    result[i] = Literal((double)lanes[idx].getf32());
  }
  return Literal(result);
}